

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O2

void __thiscall sigopcount_tests::GetSigOpCount::test_method(GetSigOpCount *this)

{
  long lVar1;
  uint uVar2;
  CScript *pCVar3;
  CScript *pCVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator pvVar6;
  iterator in_R9;
  int iVar7;
  long in_FS_OFFSET;
  bool bVar8;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string file;
  const_string file_00;
  span<const_std::byte,_18446744073709551615UL> b;
  span<const_std::byte,_18446744073709551615UL> b_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  span<const_std::byte,_18446744073709551615UL> b_01;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  span<const_std::byte,_18446744073709551615UL> b_02;
  span<const_std::byte,_18446744073709551615UL> b_03;
  span<const_std::byte,_18446744073709551615UL> b_04;
  const_string file_09;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_370;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_160;
  undefined1 local_148 [24];
  char *local_130;
  CScript s2;
  CScript scriptSig;
  CScript scriptSig2;
  CScript p2sh;
  uint160 dummy;
  CScript s1;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s1.super_CScriptBase._union._16_8_ = 0;
  s1.super_CScriptBase._24_8_ = 0;
  s1.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  s1.super_CScriptBase._union._8_8_ = 0;
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x23;
  file.m_begin = (iterator)&local_170;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_180,msg);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_188 = "";
  p2sh.super_CScriptBase._union._0_4_ = CScript::GetSigOpCount(&s1,false);
  pCVar4 = &p2sh;
  scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)(uint)scriptSig.super_CScriptBase._union._4_4_ << 0x20);
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&scriptSig2,&local_190,0x23,1,2,pCVar4,"s1.GetSigOpCount(false)",&scriptSig,"0U");
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = (iterator)pCVar4;
  msg_00.m_begin = pvVar5;
  file_00.m_end = (iterator)0x24;
  file_00.m_begin = (iterator)&local_1a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1b0,
             msg_00);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_1b8 = "";
  p2sh.super_CScriptBase._union._0_4_ = CScript::GetSigOpCount(&s1,true);
  pCVar4 = &p2sh;
  scriptSig.super_CScriptBase._union.indirect_contents.indirect =
       (char *)((ulong)scriptSig.super_CScriptBase._union.indirect_contents.indirect &
               0xffffffff00000000);
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&scriptSig2,&local_1c0,0x24,1,2,pCVar4,"s1.GetSigOpCount(true)",&scriptSig,"0U");
  dummy.super_base_blob<160U>.m_data._M_elems[0] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[1] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[2] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[3] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[4] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[5] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[6] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[7] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[8] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[9] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[10] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xb] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xc] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xd] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xe] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0xf] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x10] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x11] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x12] = '\0';
  dummy.super_base_blob<160U>.m_data._M_elems[0x13] = '\0';
  pCVar3 = CScript::operator<<(&s1,OP_1);
  ToByteVector<uint160>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig2,&dummy)
  ;
  b._M_extent._M_extent_value =
       scriptSig2.super_CScriptBase._union._8_8_ - scriptSig2.super_CScriptBase._union._0_8_;
  b._M_ptr = (pointer)scriptSig2.super_CScriptBase._union.indirect_contents.indirect;
  pCVar3 = CScript::operator<<(pCVar3,b);
  ToByteVector<uint160>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&p2sh,&dummy);
  b_00._M_extent._M_extent_value =
       p2sh.super_CScriptBase._union._8_8_ -
       (long)CONCAT44(p2sh.super_CScriptBase._union._4_4_,p2sh.super_CScriptBase._union._0_4_);
  b_00._M_ptr = (pointer)CONCAT44(p2sh.super_CScriptBase._union._4_4_,
                                  p2sh.super_CScriptBase._union._0_4_);
  pCVar3 = CScript::operator<<(pCVar3,b_00);
  pCVar3 = CScript::operator<<(pCVar3,OP_2);
  CScript::operator<<(pCVar3,OP_CHECKMULTISIG);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&p2sh);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig2);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = (iterator)pCVar4;
  msg_01.m_begin = pvVar5;
  file_01.m_end = &DAT_00000028;
  file_01.m_begin = (iterator)&local_1d0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1e0,
             msg_01);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_1e8 = "";
  p2sh.super_CScriptBase._union._0_4_ = CScript::GetSigOpCount(&s1,true);
  pCVar4 = &p2sh;
  scriptSig.super_CScriptBase._union._0_4_ = 2;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&scriptSig2,&local_1f0,0x28,1,2,pCVar4,"s1.GetSigOpCount(true)",&scriptSig,"2U");
  pCVar3 = CScript::operator<<(&s1,OP_IF);
  pCVar3 = CScript::operator<<(pCVar3,OP_CHECKSIG);
  CScript::operator<<(pCVar3,OP_ENDIF);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = (iterator)pCVar4;
  msg_02.m_begin = pvVar5;
  file_02.m_end = (iterator)0x2a;
  file_02.m_begin = (iterator)&local_200;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_210,
             msg_02);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_218 = "";
  p2sh.super_CScriptBase._union._0_4_ = CScript::GetSigOpCount(&s1,true);
  pCVar4 = &p2sh;
  scriptSig.super_CScriptBase._union._0_4_ = 3;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&scriptSig2,&local_220,0x2a,1,2,pCVar4,"s1.GetSigOpCount(true)",&scriptSig,"3U");
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = (iterator)pCVar4;
  msg_03.m_begin = pvVar5;
  file_03.m_end = (iterator)0x2b;
  file_03.m_begin = (iterator)&local_230;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_240,
             msg_03);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_250 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_248 = "";
  p2sh.super_CScriptBase._union._0_4_ = CScript::GetSigOpCount(&s1,false);
  pCVar4 = &p2sh;
  scriptSig.super_CScriptBase._union._0_4_ = 0x15;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&scriptSig2,&local_250,0x2b,1,2,pCVar4,"s1.GetSigOpCount(false)",&scriptSig,"21U");
  ScriptHash::ScriptHash((ScriptHash *)&scriptSig,&s1);
  scriptSig2.super_CScriptBase._union._16_4_ = scriptSig.super_CScriptBase._union._16_4_;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect =
       scriptSig.super_CScriptBase._union.indirect_contents.indirect;
  scriptSig2.super_CScriptBase._union._8_8_ = scriptSig.super_CScriptBase._union._8_8_;
  GetScriptForDestination(&p2sh,(CTxDestination *)&scriptSig2);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&scriptSig2);
  scriptSig.super_CScriptBase._union._16_8_ = 0;
  scriptSig.super_CScriptBase._24_8_ = 0;
  scriptSig.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptSig.super_CScriptBase._union._8_8_ = 0;
  pCVar3 = CScript::operator<<(&scriptSig,OP_0);
  Serialize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig2,&s1);
  b_01._M_extent._M_extent_value =
       scriptSig2.super_CScriptBase._union._8_8_ - scriptSig2.super_CScriptBase._union._0_8_;
  b_01._M_ptr = (pointer)scriptSig2.super_CScriptBase._union.indirect_contents.indirect;
  CScript::operator<<(pCVar3,b_01);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&scriptSig2);
  local_260 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = (iterator)pCVar4;
  msg_04.m_begin = pvVar5;
  file_04.m_end = (iterator)0x30;
  file_04.m_begin = (iterator)&local_260;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_270,
             msg_04);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_280 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_278 = "";
  s2.super_CScriptBase._union._0_4_ = CScript::GetSigOpCount(&p2sh,&scriptSig);
  pCVar4 = &s2;
  local_148._0_4_ = 3;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&scriptSig2,&local_280,0x30,1,2,pCVar4,"p2sh.GetSigOpCount(scriptSig)",local_148,"3U");
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar7 = 3;
  while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
    GenerateRandomKey(SUB81((CKey *)&s2,0));
    CKey::GetPubKey((CPubKey *)&scriptSig2,(CKey *)&s2);
    std::vector<CPubKey,_std::allocator<CPubKey>_>::emplace_back<CPubKey>
              (&keys,(CPubKey *)&scriptSig2);
    std::
    unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
    ::~unique_ptr((unique_ptr<std::array<unsigned_char,_32UL>,_SecureUniqueDeleter<std::array<unsigned_char,_32UL>_>_>
                   *)((long)&s2.super_CScriptBase._union + 8));
  }
  GetScriptForMultisig(&s2,1,&keys);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = (iterator)pCVar4;
  msg_05.m_begin = pvVar5;
  file_05.m_end = (iterator)0x39;
  file_05.m_begin = (iterator)&local_2a8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2b8,
             msg_05);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_2c0 = "";
  uVar2 = CScript::GetSigOpCount(&s2,true);
  pvVar5 = local_148;
  local_160._M_impl.super__Vector_impl_data._M_start._0_4_ = 3;
  pvVar6 = (iterator)0x2;
  local_148._0_4_ = uVar2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&scriptSig2,&local_2c8,0x39,1,2,pvVar5,"s2.GetSigOpCount(true)",&local_160,"3U");
  local_2d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_2d0 = "";
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_06.m_end = pvVar5;
  msg_06.m_begin = pvVar6;
  file_06.m_end = (iterator)0x3a;
  file_06.m_begin = (iterator)&local_2d8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_2e8,
             msg_06);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_2f0 = "";
  local_148._0_4_ = CScript::GetSigOpCount(&s2,false);
  pvVar5 = local_148;
  local_160._M_impl.super__Vector_impl_data._M_start._0_4_ = 0x14;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&scriptSig2,&local_2f8,0x3a,1,2,pvVar5,"s2.GetSigOpCount(false)",&local_160,"20U");
  ScriptHash::ScriptHash((ScriptHash *)&local_160,&s2);
  scriptSig2.super_CScriptBase._union._16_4_ =
       local_160._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect =
       (char *)CONCAT44(local_160._M_impl.super__Vector_impl_data._M_start._4_4_,
                        (uint)local_160._M_impl.super__Vector_impl_data._M_start);
  scriptSig2.super_CScriptBase._union._8_8_ = local_160._M_impl.super__Vector_impl_data._M_finish;
  GetScriptForDestination((CScript *)local_148,(CTxDestination *)&scriptSig2);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&p2sh.super_CScriptBase,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_148);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&scriptSig2);
  local_308 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_300 = "";
  local_318 = &boost::unit_test::basic_cstring<char_const>::null;
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_07.m_end = pvVar5;
  msg_07.m_begin = pvVar6;
  file_07.m_end = (iterator)0x3d;
  file_07.m_begin = (iterator)&local_308;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_318,
             msg_07);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_320 = "";
  local_148._0_4_ = CScript::GetSigOpCount(&p2sh,true);
  pvVar5 = local_148;
  local_160._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&scriptSig2,&local_328,0x3d,1,2,pvVar5,"p2sh.GetSigOpCount(true)",&local_160,"0U");
  local_338 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_330 = "";
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  local_340 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_08.m_end = pvVar5;
  msg_08.m_begin = pvVar6;
  file_08.m_end = (iterator)0x3e;
  file_08.m_begin = (iterator)&local_338;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_348,
             msg_08);
  scriptSig2.super_CScriptBase._union._8_8_ =
       scriptSig2.super_CScriptBase._union._8_8_ & 0xffffffffffffff00;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = "<W\x1b";
  scriptSig2.super_CScriptBase._union._16_8_ = boost::unit_test::lazy_ostream::inst;
  scriptSig2.super_CScriptBase._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_350 = "";
  local_148._0_4_ = CScript::GetSigOpCount(&p2sh,false);
  pvVar5 = local_148;
  local_160._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (&scriptSig2,&local_358,0x3e,1,2,pvVar5,"p2sh.GetSigOpCount(false)",&local_160,"0U");
  scriptSig2.super_CScriptBase._union._16_8_ = 0;
  scriptSig2.super_CScriptBase._24_8_ = 0;
  scriptSig2.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  scriptSig2.super_CScriptBase._union._8_8_ = 0;
  pCVar4 = CScript::operator<<(&scriptSig2,OP_1);
  ToByteVector<uint160>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_148,&dummy);
  b_02._M_extent._M_extent_value = CONCAT71(local_148._9_7_,local_148[8]) - local_148._0_8_;
  b_02._M_ptr = (pointer)local_148._0_8_;
  pCVar4 = CScript::operator<<(pCVar4,b_02);
  ToByteVector<uint160>((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_160,&dummy);
  b_03._M_extent._M_extent_value =
       (long)local_160._M_impl.super__Vector_impl_data._M_finish -
       (long)CONCAT44(local_160._M_impl.super__Vector_impl_data._M_start._4_4_,
                      (uint)local_160._M_impl.super__Vector_impl_data._M_start);
  b_03._M_ptr = (pointer)CONCAT44(local_160._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  (uint)local_160._M_impl.super__Vector_impl_data._M_start);
  pCVar4 = CScript::operator<<(pCVar4,b_03);
  Serialize((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_370,&s2);
  b_04._M_extent._M_extent_value =
       (long)local_370._M_impl.super__Vector_impl_data._M_finish -
       (long)CONCAT44(local_370._M_impl.super__Vector_impl_data._M_start._4_4_,
                      local_370._M_impl.super__Vector_impl_data._M_start._0_4_);
  b_04._M_ptr = (pointer)CONCAT44(local_370._M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_370._M_impl.super__Vector_impl_data._M_start._0_4_);
  CScript::operator<<(pCVar4,b_04);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_370);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_160);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_148);
  local_380 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_09.m_end = pvVar5;
  msg_09.m_begin = pvVar6;
  file_09.m_end = (iterator)0x41;
  file_09.m_begin = (iterator)&local_380;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_390,
             msg_09);
  local_148[8] = '\0';
  local_148._0_8_ = &PTR__lazy_ostream_01139f30;
  local_148._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_130 = "";
  local_3a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/sigopcount_tests.cpp"
  ;
  local_398 = "";
  local_160._M_impl.super__Vector_impl_data._M_start._0_4_ =
       CScript::GetSigOpCount(&p2sh,&scriptSig2);
  local_370._M_impl.super__Vector_impl_data._M_start._0_4_ = 3;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
            (local_148,&local_3a0,0x41,1,2,&local_160,"p2sh.GetSigOpCount(scriptSig2)",&local_370,
             "3U");
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig2.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&s2.super_CScriptBase);
  std::_Vector_base<CPubKey,_std::allocator<CPubKey>_>::~_Vector_base
            (&keys.super__Vector_base<CPubKey,_std::allocator<CPubKey>_>);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&scriptSig.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&p2sh.super_CScriptBase);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&s1.super_CScriptBase);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(GetSigOpCount)
{
    // Test CScript::GetSigOpCount()
    CScript s1;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(false), 0U);
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 0U);

    uint160 dummy;
    s1 << OP_1 << ToByteVector(dummy) << ToByteVector(dummy) << OP_2 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 2U);
    s1 << OP_IF << OP_CHECKSIG << OP_ENDIF;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 3U);
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(false), 21U);

    CScript p2sh = GetScriptForDestination(ScriptHash(s1));
    CScript scriptSig;
    scriptSig << OP_0 << Serialize(s1);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(scriptSig), 3U);

    std::vector<CPubKey> keys;
    for (int i = 0; i < 3; i++)
    {
        CKey k = GenerateRandomKey();
        keys.push_back(k.GetPubKey());
    }
    CScript s2 = GetScriptForMultisig(1, keys);
    BOOST_CHECK_EQUAL(s2.GetSigOpCount(true), 3U);
    BOOST_CHECK_EQUAL(s2.GetSigOpCount(false), 20U);

    p2sh = GetScriptForDestination(ScriptHash(s2));
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(true), 0U);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(false), 0U);
    CScript scriptSig2;
    scriptSig2 << OP_1 << ToByteVector(dummy) << ToByteVector(dummy) << Serialize(s2);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(scriptSig2), 3U);
}